

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

VariableLookupPtr __thiscall Lodtalk::LocalScope::lookSymbol(LocalScope *this,Oop symbol)

{
  bool bVar1;
  pointer ppVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  VariableLookupPtr VVar4;
  _Self local_60 [3];
  OopRef local_48;
  _Self local_28;
  iterator it;
  LocalScope *this_local;
  Oop symbol_local;
  
  it._M_node = (_Base_ptr)symbol.field_0;
  symbol_local.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)this;
  OopRef::OopRef(&local_48,(Oop *)&this_local);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<Lodtalk::OopRef,_std::shared_ptr<Lodtalk::VariableLookup>,_std::less<Lodtalk::OopRef>,_std::allocator<std::pair<const_Lodtalk::OopRef,_std::shared_ptr<Lodtalk::VariableLookup>_>_>_>
       ::find((map<Lodtalk::OopRef,_std::shared_ptr<Lodtalk::VariableLookup>,_std::less<Lodtalk::OopRef>,_std::allocator<std::pair<const_Lodtalk::OopRef,_std::shared_ptr<Lodtalk::VariableLookup>_>_>_>
               *)((long)symbol.field_0 + 0x18),&local_48);
  OopRef::~OopRef(&local_48);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<Lodtalk::OopRef,_std::shared_ptr<Lodtalk::VariableLookup>,_std::less<Lodtalk::OopRef>,_std::allocator<std::pair<const_Lodtalk::OopRef,_std::shared_ptr<Lodtalk::VariableLookup>_>_>_>
       ::end((map<Lodtalk::OopRef,_std::shared_ptr<Lodtalk::VariableLookup>,_std::less<Lodtalk::OopRef>,_std::allocator<std::pair<const_Lodtalk::OopRef,_std::shared_ptr<Lodtalk::VariableLookup>_>_>_>
              *)((long)symbol.field_0 + 0x18));
  bVar1 = std::operator!=(&local_28,local_60);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_Lodtalk::OopRef,_std::shared_ptr<Lodtalk::VariableLookup>_>_>
             ::operator->(&local_28);
    std::shared_ptr<Lodtalk::VariableLookup>::shared_ptr
              ((shared_ptr<Lodtalk::VariableLookup> *)this,&ppVar2->second);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    std::shared_ptr<Lodtalk::VariableLookup>::shared_ptr
              ((shared_ptr<Lodtalk::VariableLookup> *)this);
    _Var3._M_pi = extraout_RDX_00;
  }
  VVar4.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  VVar4.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (VariableLookupPtr)
         VVar4.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VariableLookupPtr LocalScope::lookSymbol(Oop symbol)
{
	auto it = variables.find(symbol);
	if(it != variables.end())
		return it->second;
	return VariableLookupPtr();
}